

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O0

void __thiscall
psy::C::TypeCheckerTester::checkTypes(TypeCheckerTester *this,string *text,Expectation *X)

{
  InternalsTestSuite *this_00;
  Expectation local_f8;
  string local_40;
  Expectation *local_20;
  Expectation *X_local;
  string *text_local;
  TypeCheckerTester *this_local;
  
  this_00 = (InternalsTestSuite *)(this->super_Tester).suite_;
  local_20 = X;
  X_local = (Expectation *)text;
  text_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)text);
  Expectation::Expectation(&local_f8,X);
  InternalsTestSuite::checkTypes(this_00,&local_40,&local_f8);
  Expectation::~Expectation(&local_f8);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void TypeCheckerTester::checkTypes(std::string text, Expectation X)
{
    (static_cast<InternalsTestSuite*>(suite_)->checkTypes(text, X));
}